

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thief.c
# Opt level: O0

void disguise_remove(CHAR_DATA *ch)

{
  char *pcVar1;
  long in_RDI;
  char *in_stack_00000028;
  
  free_pstring((char *)ch);
  pcVar1 = palloc_string(in_stack_00000028);
  *(char **)(in_RDI + 0xe8) = pcVar1;
  free_pstring((char *)ch);
  pcVar1 = palloc_string(in_stack_00000028);
  *(char **)(in_RDI + 0x108) = pcVar1;
  free_pstring((char *)ch);
  pcVar1 = palloc_string(in_stack_00000028);
  *(char **)(in_RDI + 0x110) = pcVar1;
  free_pstring((char *)ch);
  pcVar1 = palloc_string(in_stack_00000028);
  *(char **)(in_RDI + 0x118) = pcVar1;
  free_oldchar((OLD_CHAR *)0x75fb7f);
  *(undefined8 *)(*(long *)(in_RDI + 0xc0) + 0xba8) = 0;
  return;
}

Assistant:

void disguise_remove(CHAR_DATA *ch)
{
	free_pstring(ch->name);
	ch->name = palloc_string(ch->pcdata->old->name);

	free_pstring(ch->short_descr);
	ch->short_descr = palloc_string(ch->pcdata->old->short_descr);

	free_pstring(ch->long_descr);
	ch->long_descr = palloc_string(ch->pcdata->old->long_descr);

	free_pstring(ch->description);
	ch->description = palloc_string(ch->pcdata->old->description);

	free_oldchar(ch->pcdata->old);
	ch->pcdata->old = nullptr;
}